

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O2

int __thiscall RandStrParser::parseInt(RandStrParser *this)

{
  wchar_t wVar1;
  int iVar2;
  
  iVar2 = 0;
  while( true ) {
    if (this->rem == 0) {
      return iVar2;
    }
    wVar1 = getch(this);
    if ((uint)(wVar1 + L'\xffffffc6') < 0xfffffff6) break;
    wVar1 = getch(this);
    iVar2 = iVar2 * 10 + wVar1 + -0x30;
    skip(this);
  }
  return iVar2;
}

Assistant:

int parseInt()
    {
        /* parse digits in the input */
        int acc;
        for (acc = 0 ; more() && is_digit(getch()) ; skip())
        {
            /* add this digit into the accumulator */
            acc *= 10;
            acc += value_of_digit(getch());
        }

        /* return the accumulator value */
        return acc;
    }